

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm.h
# Opt level: O3

void ncnn::conv_im2col_sgemm_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *_bias,int kernel_w,int kernel_h,
               int stride_w,int stride_h,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  ulong uVar18;
  Allocator *pAVar19;
  size_t sVar20;
  void *pvVar21;
  size_t sVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  int iVar42;
  undefined4 *puVar43;
  uint uVar44;
  int iVar45;
  long lVar46;
  float *pfVar47;
  uint uVar48;
  int iVar49;
  int iVar50;
  void **ppvVar51;
  long lVar52;
  ulong uVar53;
  ulong uVar54;
  float *pfVar55;
  ulong uVar56;
  void *__ptr;
  int iVar57;
  int *piVar58;
  uint uVar59;
  float *pfVar60;
  ulong uVar61;
  int iVar62;
  void **ppvVar63;
  int iVar64;
  undefined4 *puVar65;
  int iVar66;
  uint uVar67;
  undefined4 *puVar68;
  float *pfVar69;
  int iVar70;
  uint uVar71;
  float *pfVar72;
  float *pfVar73;
  float *ret;
  float *pfVar74;
  int iVar75;
  ulong uVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  int L;
  void *ptr;
  ulong local_f8;
  void *local_b8;
  undefined8 uStack_b0;
  ulong local_a0;
  Mat *local_98;
  Mat *local_90;
  void *local_88;
  int *piStack_80;
  ulong local_78;
  undefined4 local_70;
  Allocator *local_68;
  undefined4 local_60;
  uint local_5c;
  uint local_58;
  undefined4 local_54;
  long local_50;
  long local_40;
  void *local_38;
  
  local_98 = _bias;
  iVar75 = bottom_blob->w;
  uVar71 = bottom_blob->c;
  uVar18 = bottom_blob->elemsize;
  uVar59 = top_blob->w;
  iVar17 = top_blob->h;
  uVar44 = uVar59 * iVar17;
  iVar64 = kernel_h * kernel_w;
  uVar48 = uVar71 * iVar64;
  local_90 = top_blob;
  local_68 = opt->workspace_allocator;
  local_88 = (void *)0x0;
  piStack_80 = (int *)0x0;
  local_78 = uVar18;
  local_70 = 1;
  local_60 = 2;
  local_5c = uVar44;
  local_58 = uVar48;
  local_54 = 1;
  iVar42 = uVar44 * uVar48;
  local_50 = (long)iVar42;
  local_a0 = (long)top_blob->c;
  if (iVar42 != 0) {
    uVar56 = (long)iVar42 * uVar18 + 3 & 0xfffffffffffffffc;
    if (local_68 == (Allocator *)0x0) {
      local_b8 = (void *)0x0;
      iVar42 = posix_memalign(&local_b8,0x10,uVar56 + 4);
      local_88 = (void *)0x0;
      if (iVar42 == 0) {
        local_88 = local_b8;
      }
    }
    else {
      local_88 = (void *)(**(code **)(*(long *)local_68 + 0x10))();
    }
    piStack_80 = (int *)((long)local_88 + uVar56);
    *(undefined4 *)((long)local_88 + uVar56) = 1;
  }
  uVar56 = local_a0;
  if (0 < (int)uVar71) {
    local_38 = bottom_blob->data;
    local_40 = bottom_blob->cstep * bottom_blob->elemsize;
    local_f8 = 0;
    do {
      if (0 < kernel_h) {
        iVar66 = iVar17 * iVar64 * uVar59 * (int)local_f8;
        iVar42 = 0;
        iVar50 = 0;
        do {
          if (0 < kernel_w) {
            iVar57 = 0;
            iVar45 = iVar42;
            do {
              if (0 < iVar17) {
                iVar62 = 0;
                iVar70 = iVar45;
                do {
                  if (0 < (int)uVar59) {
                    uVar76 = 0;
                    iVar49 = iVar70;
                    do {
                      *(undefined4 *)((long)local_88 + uVar76 * 4 + (long)iVar66 * 4) =
                           *(undefined4 *)((long)local_38 + (long)iVar49 * 4 + local_40 * local_f8);
                      uVar76 = uVar76 + 1;
                      iVar49 = iVar49 + stride_w;
                    } while (uVar59 != uVar76);
                    iVar66 = iVar66 + (int)uVar76;
                  }
                  iVar62 = iVar62 + 1;
                  iVar70 = iVar70 + stride_h * iVar75;
                } while (iVar62 != iVar17);
              }
              iVar57 = iVar57 + 1;
              iVar45 = iVar45 + 1;
            } while (iVar57 != kernel_w);
          }
          iVar50 = iVar50 + 1;
          iVar42 = iVar42 + iVar75;
        } while (iVar50 != kernel_h);
      }
      local_f8 = local_f8 + 1;
    } while (local_f8 != uVar71);
  }
  uVar59 = uVar44 + 3;
  if (-1 < (int)uVar44) {
    uVar59 = uVar44;
  }
  pAVar19 = opt->workspace_allocator;
  piVar58 = (int *)0x0;
  uVar76 = ((long)(int)(iVar64 * uVar71 * 4) * uVar18 + 0xf & 0xfffffffffffffff0) / uVar18;
  lVar52 = (long)(int)(uVar44 + ((int)uVar59 >> 2) * -3) * uVar76;
  __ptr = (void *)0x0;
  if (lVar52 != 0) {
    uVar53 = lVar52 * uVar18 + 3 & 0xfffffffffffffffc;
    if (pAVar19 == (Allocator *)0x0) {
      local_b8 = (void *)0x0;
      iVar75 = posix_memalign(&local_b8,0x10,uVar53 + 4);
      __ptr = (void *)0x0;
      if (iVar75 == 0) {
        __ptr = local_b8;
      }
    }
    else {
      __ptr = (void *)(**(code **)(*(long *)pAVar19 + 0x10))(pAVar19,uVar53 + 4);
    }
    piVar58 = (int *)(uVar53 + (long)__ptr);
    *(undefined4 *)((long)__ptr + uVar53) = 1;
  }
  if (0 < (int)uVar44 >> 2) {
    lVar52 = 0;
    uVar53 = 0;
    do {
      if (0 < (int)uVar48) {
        puVar65 = (undefined4 *)(uVar76 * uVar18 * uVar53 + (long)__ptr);
        puVar68 = (undefined4 *)((long)local_88 + lVar52);
        uVar71 = uVar48;
        do {
          uVar23 = puVar68[1];
          uVar24 = puVar68[2];
          uVar25 = puVar68[3];
          *puVar65 = *puVar68;
          puVar65[1] = uVar23;
          puVar65[2] = uVar24;
          puVar65[3] = uVar25;
          puVar65 = puVar65 + 4;
          puVar68 = puVar68 + uVar44;
          uVar71 = uVar71 - 1;
        } while (uVar71 != 0);
      }
      uVar53 = uVar53 + 1;
      lVar52 = lVar52 + 0x10;
    } while (uVar53 != (uint)((int)uVar44 >> 2));
  }
  lVar52 = (long)(int)uVar44;
  if ((uVar44 & 0xfffffffc) != uVar44) {
    lVar46 = (long)(int)(uVar44 & 0xfffffffc);
    puVar65 = (undefined4 *)(lVar46 * 4 + (long)local_88);
    do {
      if (0 < (int)uVar48) {
        uVar71 = (uint)lVar46;
        uVar59 = uVar71 + 3;
        if (-1 < (int)uVar71) {
          uVar59 = uVar71;
        }
        puVar43 = (undefined4 *)
                  ((long)(int)(((int)uVar59 >> 2) + (uVar71 - (uVar59 & 0xfffffffc))) *
                   uVar76 * uVar18 + (long)__ptr);
        puVar68 = puVar65;
        uVar71 = uVar48;
        do {
          *puVar43 = *puVar68;
          puVar43 = puVar43 + 1;
          puVar68 = puVar68 + lVar52;
          uVar71 = uVar71 - 1;
        } while (uVar71 != 0);
      }
      lVar46 = lVar46 + 1;
      puVar65 = puVar65 + 1;
    } while (lVar46 < lVar52);
  }
  uVar71 = (int)uVar56 >> 2;
  uVar56 = uVar56 & 0xfffffffffffffffc;
  if (0 < (int)uVar71) {
    uVar53 = 0;
    do {
      sVar20 = local_90->cstep;
      pvVar21 = local_90->data;
      sVar22 = local_90->elemsize;
      pfVar72 = (float *)(uVar53 * 4 * sVar20 * sVar22 + (long)pvVar21);
      pfVar73 = (float *)((uVar53 * 4 + 1) * sVar20 * sVar22 + (long)pvVar21);
      pfVar47 = (float *)((uVar53 * 4 + 2) * sVar20 * sVar22 + (long)pvVar21);
      pfVar69 = (float *)((uVar53 * 4 + 3) * sVar20 * sVar22 + (long)pvVar21);
      ppvVar51 = &local_98->data + uVar53 * 2;
      if (local_98 == (Mat *)0x0) {
        ppvVar51 = &local_b8;
      }
      local_b8 = (void *)0x0;
      uStack_b0 = 0;
      if ((int)uVar44 < 4) {
        uVar61 = 0;
      }
      else {
        ppvVar63 = &local_98->data + uVar53 * 2;
        if (local_98 == (Mat *)0x0) {
          ppvVar63 = &local_b8;
        }
        uVar54 = 0;
        do {
          pfVar74 = (float *)((uVar54 >> 2) * uVar76 * uVar18 + (long)__ptr);
          pfVar60 = (float *)(kernel_tm->cstep * uVar53 * kernel_tm->elemsize +
                             (long)kernel_tm->data);
          fVar77 = *(float *)ppvVar51;
          fVar81 = *(float *)((long)ppvVar63 + 4);
          fVar85 = *(float *)(ppvVar63 + 1);
          fVar89 = *(float *)((long)ppvVar63 + 0xc);
          fVar78 = fVar77;
          fVar79 = fVar77;
          fVar80 = fVar77;
          fVar82 = fVar81;
          fVar83 = fVar81;
          fVar84 = fVar81;
          fVar86 = fVar85;
          fVar87 = fVar85;
          fVar88 = fVar85;
          fVar90 = fVar89;
          fVar91 = fVar89;
          fVar92 = fVar89;
          uVar59 = 0;
          if (3 < (int)uVar48) {
            iVar75 = 3;
            do {
              fVar1 = *pfVar60;
              fVar2 = pfVar60[1];
              fVar3 = pfVar60[2];
              fVar4 = pfVar60[3];
              fVar26 = *pfVar74;
              fVar27 = pfVar74[1];
              fVar28 = pfVar74[2];
              fVar29 = pfVar74[3];
              fVar30 = pfVar74[4];
              fVar31 = pfVar74[5];
              fVar32 = pfVar74[6];
              fVar33 = pfVar74[7];
              fVar34 = pfVar74[8];
              fVar35 = pfVar74[9];
              fVar36 = pfVar74[10];
              fVar37 = pfVar74[0xb];
              fVar38 = pfVar74[0xc];
              fVar39 = pfVar74[0xd];
              fVar40 = pfVar74[0xe];
              fVar41 = pfVar74[0xf];
              fVar5 = pfVar60[4];
              fVar6 = pfVar60[5];
              fVar7 = pfVar60[6];
              fVar8 = pfVar60[7];
              fVar9 = pfVar60[8];
              fVar10 = pfVar60[9];
              fVar11 = pfVar60[10];
              fVar12 = pfVar60[0xb];
              fVar13 = pfVar60[0xc];
              fVar14 = pfVar60[0xd];
              fVar15 = pfVar60[0xe];
              fVar16 = pfVar60[0xf];
              fVar77 = fVar13 * fVar38 + fVar9 * fVar34 + fVar5 * fVar30 + fVar1 * fVar26 + fVar77;
              fVar78 = fVar13 * fVar39 + fVar9 * fVar35 + fVar5 * fVar31 + fVar1 * fVar27 + fVar78;
              fVar79 = fVar13 * fVar40 + fVar9 * fVar36 + fVar5 * fVar32 + fVar1 * fVar28 + fVar79;
              fVar80 = fVar13 * fVar41 + fVar9 * fVar37 + fVar5 * fVar33 + fVar1 * fVar29 + fVar80;
              fVar81 = fVar14 * fVar38 + fVar10 * fVar34 + fVar6 * fVar30 + fVar2 * fVar26 + fVar81;
              fVar82 = fVar14 * fVar39 + fVar10 * fVar35 + fVar6 * fVar31 + fVar2 * fVar27 + fVar82;
              fVar83 = fVar14 * fVar40 + fVar10 * fVar36 + fVar6 * fVar32 + fVar2 * fVar28 + fVar83;
              fVar84 = fVar14 * fVar41 + fVar10 * fVar37 + fVar6 * fVar33 + fVar2 * fVar29 + fVar84;
              fVar85 = fVar15 * fVar38 + fVar11 * fVar34 + fVar7 * fVar30 + fVar3 * fVar26 + fVar85;
              fVar86 = fVar15 * fVar39 + fVar11 * fVar35 + fVar7 * fVar31 + fVar3 * fVar27 + fVar86;
              fVar87 = fVar15 * fVar40 + fVar11 * fVar36 + fVar7 * fVar32 + fVar3 * fVar28 + fVar87;
              fVar88 = fVar15 * fVar41 + fVar11 * fVar37 + fVar7 * fVar33 + fVar3 * fVar29 + fVar88;
              fVar89 = fVar16 * fVar38 + fVar12 * fVar34 + fVar8 * fVar30 + fVar4 * fVar26 + fVar89;
              fVar90 = fVar16 * fVar39 + fVar12 * fVar35 + fVar8 * fVar31 + fVar4 * fVar27 + fVar90;
              fVar91 = fVar16 * fVar40 + fVar12 * fVar36 + fVar8 * fVar32 + fVar4 * fVar28 + fVar91;
              fVar92 = fVar16 * fVar41 + fVar12 * fVar37 + fVar8 * fVar33 + fVar4 * fVar29 + fVar92;
              pfVar60 = pfVar60 + 0x10;
              pfVar74 = pfVar74 + 0x10;
              iVar75 = iVar75 + 4;
              uVar59 = uVar48 & 0xfffffffc;
            } while (iVar75 < (int)uVar48);
          }
          iVar75 = uVar48 - uVar59;
          if (iVar75 != 0 && (int)uVar59 <= (int)uVar48) {
            lVar46 = 0;
            do {
              pfVar55 = (float *)((long)pfVar74 + lVar46);
              fVar5 = *pfVar55;
              fVar6 = pfVar55[1];
              fVar7 = pfVar55[2];
              fVar8 = pfVar55[3];
              fVar1 = *(float *)((long)pfVar60 + lVar46);
              fVar2 = *(float *)((long)pfVar60 + lVar46 + 4);
              fVar3 = *(float *)((long)pfVar60 + lVar46 + 8);
              fVar4 = *(float *)((long)pfVar60 + lVar46 + 0xc);
              fVar77 = fVar77 + fVar1 * fVar5;
              fVar78 = fVar78 + fVar1 * fVar6;
              fVar79 = fVar79 + fVar1 * fVar7;
              fVar80 = fVar80 + fVar1 * fVar8;
              fVar81 = fVar81 + fVar2 * fVar5;
              fVar82 = fVar82 + fVar2 * fVar6;
              fVar83 = fVar83 + fVar2 * fVar7;
              fVar84 = fVar84 + fVar2 * fVar8;
              fVar85 = fVar85 + fVar3 * fVar5;
              fVar86 = fVar86 + fVar3 * fVar6;
              fVar87 = fVar87 + fVar3 * fVar7;
              fVar88 = fVar88 + fVar3 * fVar8;
              fVar89 = fVar89 + fVar4 * fVar5;
              fVar90 = fVar90 + fVar4 * fVar6;
              fVar91 = fVar91 + fVar4 * fVar7;
              fVar92 = fVar92 + fVar4 * fVar8;
              lVar46 = lVar46 + 0x10;
              iVar75 = iVar75 + -1;
            } while (iVar75 != 0);
          }
          *pfVar72 = fVar77;
          pfVar72[1] = fVar78;
          pfVar72[2] = fVar79;
          pfVar72[3] = fVar80;
          *pfVar73 = fVar81;
          pfVar73[1] = fVar82;
          pfVar73[2] = fVar83;
          pfVar73[3] = fVar84;
          *pfVar47 = fVar85;
          pfVar47[1] = fVar86;
          pfVar47[2] = fVar87;
          pfVar47[3] = fVar88;
          *pfVar69 = fVar89;
          pfVar69[1] = fVar90;
          pfVar69[2] = fVar91;
          pfVar69[3] = fVar92;
          pfVar72 = pfVar72 + 4;
          pfVar73 = pfVar73 + 4;
          pfVar47 = pfVar47 + 4;
          pfVar69 = pfVar69 + 4;
          uVar61 = uVar54 + 4;
          lVar46 = uVar54 + 7;
          uVar54 = uVar61;
        } while (lVar46 < lVar52);
      }
      if ((int)uVar61 < (int)uVar44) {
        pfVar60 = (float *)(kernel_tm->cstep * uVar53 * kernel_tm->elemsize + (long)kernel_tm->data)
        ;
        do {
          pfVar55 = (float *)((ulong)(((uint)uVar61 & 3) + ((uint)(uVar61 >> 2) & 0x3fffffff)) *
                              uVar76 * uVar18 + (long)__ptr);
          pfVar74 = pfVar60;
          if ((int)uVar48 < 4) {
            fVar77 = 0.0;
            fVar81 = 0.0;
            fVar85 = 0.0;
            fVar89 = 0.0;
            fVar88 = 0.0;
            fVar90 = 0.0;
            fVar91 = 0.0;
            fVar92 = 0.0;
            fVar83 = 0.0;
            fVar84 = 0.0;
            fVar86 = 0.0;
            fVar87 = 0.0;
            fVar78 = 0.0;
            fVar79 = 0.0;
            fVar80 = 0.0;
            fVar82 = 0.0;
            uVar59 = 0;
          }
          else {
            fVar78 = 0.0;
            fVar79 = 0.0;
            fVar80 = 0.0;
            fVar82 = 0.0;
            iVar75 = 3;
            fVar83 = 0.0;
            fVar84 = 0.0;
            fVar86 = 0.0;
            fVar87 = 0.0;
            fVar88 = 0.0;
            fVar90 = 0.0;
            fVar91 = 0.0;
            fVar92 = 0.0;
            fVar77 = 0.0;
            fVar81 = 0.0;
            fVar85 = 0.0;
            fVar89 = 0.0;
            do {
              fVar1 = *pfVar55;
              fVar2 = pfVar55[1];
              fVar3 = pfVar55[2];
              fVar4 = pfVar55[3];
              fVar77 = fVar77 + *pfVar74 * fVar1;
              fVar81 = fVar81 + pfVar74[1] * fVar1;
              fVar85 = fVar85 + pfVar74[2] * fVar1;
              fVar89 = fVar89 + pfVar74[3] * fVar1;
              fVar88 = fVar88 + pfVar74[4] * fVar2;
              fVar90 = fVar90 + pfVar74[5] * fVar2;
              fVar91 = fVar91 + pfVar74[6] * fVar2;
              fVar92 = fVar92 + pfVar74[7] * fVar2;
              fVar83 = fVar83 + pfVar74[8] * fVar3;
              fVar84 = fVar84 + pfVar74[9] * fVar3;
              fVar86 = fVar86 + pfVar74[10] * fVar3;
              fVar87 = fVar87 + pfVar74[0xb] * fVar3;
              fVar78 = fVar78 + pfVar74[0xc] * fVar4;
              fVar79 = fVar79 + pfVar74[0xd] * fVar4;
              fVar80 = fVar80 + pfVar74[0xe] * fVar4;
              fVar82 = fVar82 + pfVar74[0xf] * fVar4;
              pfVar74 = pfVar74 + 0x10;
              pfVar55 = pfVar55 + 4;
              iVar75 = iVar75 + 4;
              uVar59 = uVar48 & 0xfffffffc;
            } while (iVar75 < (int)uVar48);
          }
          fVar77 = *(float *)ppvVar51 + fVar78 + fVar77 + fVar88 + fVar83;
          fVar81 = *(float *)((long)ppvVar51 + 4) + fVar79 + fVar81 + fVar90 + fVar84;
          fVar85 = *(float *)(ppvVar51 + 1) + fVar80 + fVar85 + fVar91 + fVar86;
          fVar89 = *(float *)((long)ppvVar51 + 0xc) + fVar82 + fVar89 + fVar92 + fVar87;
          if ((int)uVar59 < (int)uVar48) {
            lVar46 = 0;
            do {
              fVar78 = pfVar55[lVar46];
              fVar77 = fVar77 + *pfVar74 * fVar78;
              fVar81 = fVar81 + pfVar74[1] * fVar78;
              fVar85 = fVar85 + pfVar74[2] * fVar78;
              fVar89 = fVar89 + pfVar74[3] * fVar78;
              pfVar74 = pfVar74 + 4;
              lVar46 = lVar46 + 1;
            } while (uVar48 - uVar59 != (int)lVar46);
          }
          *pfVar72 = fVar77;
          *pfVar73 = fVar81;
          *pfVar47 = fVar85;
          *pfVar69 = fVar89;
          pfVar72 = pfVar72 + 1;
          pfVar73 = pfVar73 + 1;
          pfVar47 = pfVar47 + 1;
          pfVar69 = pfVar69 + 1;
          uVar59 = (uint)uVar61 + 1;
          uVar61 = (ulong)uVar59;
        } while (uVar59 != uVar44);
      }
      uVar53 = uVar53 + 1;
    } while (uVar53 != uVar71);
  }
  if ((int)uVar56 != (int)local_a0) {
    do {
      if (local_98 == (Mat *)0x0) {
        fVar77 = 0.0;
      }
      else {
        fVar77 = *(float *)((long)&local_98->data + uVar56 * 4);
      }
      pfVar47 = (float *)(local_90->cstep * uVar56 * local_90->elemsize + (long)local_90->data);
      uVar53 = 0;
      uVar71 = (uint)uVar56;
      if (3 < (int)uVar44) {
        uVar59 = uVar71 + 3;
        if (-1 < (int)uVar71) {
          uVar59 = uVar71;
        }
        uVar61 = 0;
        do {
          pfVar69 = (float *)((uVar61 >> 2) * uVar76 * uVar18 + (long)__ptr);
          pfVar72 = (float *)(kernel_tm->cstep *
                              (long)(int)(((int)uVar59 >> 2) + (uVar71 - (uVar59 & 0xfffffffc))) *
                              kernel_tm->elemsize + (long)kernel_tm->data);
          fVar81 = fVar77;
          fVar85 = fVar77;
          fVar89 = fVar77;
          fVar78 = fVar77;
          uVar67 = 0;
          if (3 < (int)uVar48) {
            iVar75 = 3;
            do {
              fVar79 = *pfVar72;
              fVar80 = pfVar72[1];
              fVar82 = pfVar72[2];
              fVar83 = pfVar72[3];
              fVar81 = pfVar69[0xc] * fVar83 +
                       pfVar69[8] * fVar82 + pfVar69[4] * fVar80 + *pfVar69 * fVar79 + fVar81;
              fVar85 = pfVar69[0xd] * fVar83 +
                       pfVar69[9] * fVar82 + pfVar69[5] * fVar80 + pfVar69[1] * fVar79 + fVar85;
              fVar89 = pfVar69[0xe] * fVar83 +
                       pfVar69[10] * fVar82 + pfVar69[6] * fVar80 + pfVar69[2] * fVar79 + fVar89;
              fVar78 = pfVar69[0xf] * fVar83 +
                       pfVar69[0xb] * fVar82 + pfVar69[7] * fVar80 + pfVar69[3] * fVar79 + fVar78;
              pfVar72 = pfVar72 + 4;
              pfVar69 = pfVar69 + 0x10;
              iVar75 = iVar75 + 4;
              uVar67 = uVar48 & 0xfffffffc;
            } while (iVar75 < (int)uVar48);
          }
          if ((int)uVar67 < (int)uVar48) {
            lVar46 = 0;
            do {
              fVar79 = pfVar72[lVar46];
              fVar81 = fVar81 + *pfVar69 * fVar79;
              fVar85 = fVar85 + pfVar69[1] * fVar79;
              fVar89 = fVar89 + pfVar69[2] * fVar79;
              fVar78 = fVar78 + pfVar69[3] * fVar79;
              pfVar69 = pfVar69 + 4;
              lVar46 = lVar46 + 1;
            } while (uVar48 - uVar67 != (int)lVar46);
          }
          *pfVar47 = fVar81;
          pfVar47[1] = fVar85;
          pfVar47[2] = fVar89;
          pfVar47[3] = fVar78;
          pfVar47 = pfVar47 + 4;
          uVar53 = uVar61 + 4;
          lVar46 = uVar61 + 7;
          uVar61 = uVar53;
        } while (lVar46 < lVar52);
      }
      if ((int)uVar53 < (int)uVar44) {
        uVar59 = uVar71 + 3;
        if (-1 < (int)uVar71) {
          uVar59 = uVar71;
        }
        pfVar69 = (float *)((long)(int)(((int)uVar59 >> 2) + (uVar71 - (uVar59 & 0xfffffffc))) *
                            kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
        do {
          pfVar73 = (float *)((ulong)(((uint)uVar53 & 3) + ((uint)(uVar53 >> 2) & 0x3fffffff)) *
                              uVar76 * uVar18 + (long)__ptr);
          pfVar72 = pfVar69;
          if ((int)uVar48 < 4) {
            fVar81 = 0.0;
            fVar85 = 0.0;
            fVar89 = 0.0;
            fVar78 = 0.0;
            uVar71 = 0;
          }
          else {
            fVar81 = 0.0;
            fVar85 = 0.0;
            fVar89 = 0.0;
            fVar78 = 0.0;
            iVar75 = 3;
            do {
              fVar81 = fVar81 + *pfVar72 * *pfVar73;
              fVar85 = fVar85 + pfVar72[1] * pfVar73[1];
              fVar89 = fVar89 + pfVar72[2] * pfVar73[2];
              fVar78 = fVar78 + pfVar72[3] * pfVar73[3];
              pfVar72 = pfVar72 + 4;
              pfVar73 = pfVar73 + 4;
              iVar75 = iVar75 + 4;
              uVar71 = uVar48 & 0xfffffffc;
            } while (iVar75 < (int)uVar48);
          }
          fVar81 = fVar78 + fVar85 + fVar89 + fVar81 + fVar77;
          if ((int)uVar71 < (int)uVar48) {
            lVar46 = 0;
            do {
              fVar81 = fVar81 + pfVar73[lVar46] * pfVar72[lVar46];
              lVar46 = lVar46 + 1;
            } while (uVar48 - uVar71 != (int)lVar46);
          }
          *pfVar47 = fVar81;
          pfVar47 = pfVar47 + 1;
          uVar71 = (uint)uVar53 + 1;
          uVar53 = (ulong)uVar71;
        } while (uVar71 != uVar44);
      }
      uVar56 = uVar56 + 1;
    } while ((long)uVar56 < (long)local_a0);
  }
  if (piVar58 != (int *)0x0) {
    LOCK();
    *piVar58 = *piVar58 + -1;
    UNLOCK();
    if (*piVar58 == 0) {
      if (pAVar19 == (Allocator *)0x0) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
      }
      else {
        (**(code **)(*(long *)pAVar19 + 0x18))(pAVar19,__ptr);
      }
    }
  }
  if (piStack_80 != (int *)0x0) {
    LOCK();
    *piStack_80 = *piStack_80 + -1;
    UNLOCK();
    if (*piStack_80 == 0) {
      if (local_68 == (Allocator *)0x0) {
        if (local_88 != (void *)0x0) {
          free(local_88);
        }
      }
      else {
        (**(code **)(*(long *)local_68 + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv_im2col_sgemm_sse(const Mat &bottom_blob, Mat &top_blob, const Mat & kernel_tm, const Mat& _bias, \
            const int kernel_w, const int kernel_h, const int stride_w, const int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const float* bias = _bias;

    // im2col
    Mat bottom_im2col(outw*outh, kernel_h*kernel_w*inch, elemsize, opt.workspace_allocator);
    {
        const int stride = kernel_h*kernel_w*outw*outh;
        float* ret = (float*)bottom_im2col;
    
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<inch; p++)
        {
            const float* input = bottom_blob.channel(p);
            int retID = stride * p;
            for (int u=0; u<kernel_h; u++)
            {
                for (int v=0; v<kernel_w; v++)
                {
                    for (int i=0; i<outh; i++)
                    {
                        for (int j=0; j<outw; j++)
                        {
                            int row = u + i * stride_h;
                            int col = v + j * stride_w;
                            int index = row * w + col;
                            ret[retID] = input[index];
                            retID++;
                        }
                    }
                }
            }
        }
    }

    int kernel_size = kernel_w * kernel_h;
    int out_size = outw * outh;

    // bottom_im2col memory packed 4 x 4
    Mat bottom_tm(4*kernel_size, inch, out_size/4 + out_size%4, elemsize, opt.workspace_allocator);
    {
        int nn_size = out_size >> 2;
        int remain_size_start = nn_size << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii=0; ii<nn_size; ii++)
        {
            int i = ii * 4;

            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4);

            for (int q=0; q<inch*kernel_size; q++)
            {
#if __SSE__
                _mm_storeu_ps(tmpptr, _mm_loadu_ps(img0));
#else                
                tmpptr[0] = img0[0];
                tmpptr[1] = img0[1];
                tmpptr[2] = img0[2];
                tmpptr[3] = img0[3];
#endif // __SSE__              
                tmpptr += 4;
                img0 += out_size;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_size_start; i<out_size; i++)
        {
            const float* img0 = bottom_im2col.channel(0);
            img0 += i;

            float* tmpptr = bottom_tm.channel(i/4 + i%4);

            for (int q=0; q<inch*kernel_size; q++)
            {
                tmpptr[0] = img0[0];

                tmpptr += 1;
                img0 += out_size;
            }
        }
    }
    
    // sgemm(int M, int N, int L, float* A, float* B, float* C)
    {
        //int M = outch;                    // outch
        int N = outw * outh;                // outsize or out stride
        int L = kernel_w * kernel_h * inch; // ksize * inch

        int nn_outch = 0;
        int remain_outch_start = 0;

        nn_outch = outch >> 2;
        remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int i =  pp * 4;

            float* output0 = top_blob.channel(i);
            float* output1 = top_blob.channel(i+1);
            float* output2 = top_blob.channel(i+2);
            float* output3 = top_blob.channel(i+3);

            const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
            const float* biasptr = bias ? bias + i : zeros;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(biasptr[0]);
                __m128 _sum1 = _mm_set1_ps(biasptr[1]);
                __m128 _sum2 = _mm_set1_ps(biasptr[2]);
                __m128 _sum3 = _mm_set1_ps(biasptr[3]);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30

                    // k1
                    _vb = _mm_loadu_ps(vb+4);
                    _va0 = _mm_set1_ps(va[4]);
                    _va1 = _mm_set1_ps(va[5]);
                    _va2 = _mm_set1_ps(va[6]);
                    _va3 = _mm_set1_ps(va[7]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a10-a13) * k01
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a10-a13) * k11
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a10-a13) * k21
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a10-a13) * k31

                    // k2
                    _vb = _mm_loadu_ps(vb+8);
                    _va0 = _mm_set1_ps(va[8]);
                    _va1 = _mm_set1_ps(va[9]);
                    _va2 = _mm_set1_ps(va[10]);
                    _va3 = _mm_set1_ps(va[11]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a20-a23) * k02
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a20-a23) * k12
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a20-a23) * k22
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a20-a23) * k32

                    // k3
                    _vb = _mm_loadu_ps(vb+12);
                    _va0 = _mm_set1_ps(va[12]);
                    _va1 = _mm_set1_ps(va[13]);
                    _va2 = _mm_set1_ps(va[14]);
                    _va3 = _mm_set1_ps(va[15]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a30-a33) * k03
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a30-a33) * k13
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a30-a33) * k23
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a30-a33) * k33

                    va += 16;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _vb = _mm_loadu_ps(vb);
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb, _va0));// sum0 = (a00-a03) * k00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_vb, _va1));// sum1 = (a00-a03) * k10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_vb, _va2));// sum2 = (a00-a03) * k20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_vb, _va3));// sum3 = (a00-a03) * k30
                    
                    va += 4;
                    vb += 4;
                }
                _mm_storeu_ps(output0, _sum0);
                _mm_storeu_ps(output1, _sum1);
                _mm_storeu_ps(output2, _sum2);
                _mm_storeu_ps(output3, _sum3);
#else
                float sum0[4] = {0};
                float sum1[4] = {0};
                float sum2[4] = {0};
                float sum3[4] = {0};
               
                int k=0;
                for (; k+7<L; k=k+8)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                        va += 4;

                        sum0[n] += va[0] * vb[n+4];
                        sum1[n] += va[1] * vb[n+4];
                        sum2[n] += va[2] * vb[n+4];
                        sum3[n] += va[3] * vb[n+4];
                        va += 4;

                        sum0[n] += va[0] * vb[n+8];
                        sum1[n] += va[1] * vb[n+8];
                        sum2[n] += va[2] * vb[n+8];
                        sum3[n] += va[3] * vb[n+8];
                        va += 4;

                        sum0[n] += va[0] * vb[n+12];
                        sum1[n] += va[1] * vb[n+12];
                        sum2[n] += va[2] * vb[n+12];
                        sum3[n] += va[3] * vb[n+12];
                        va += 4;

                        sum0[n] += va[0] * vb[n+16];
                        sum1[n] += va[1] * vb[n+16];
                        sum2[n] += va[2] * vb[n+16];
                        sum3[n] += va[3] * vb[n+16];
                        va += 4;

                        sum0[n] += va[0] * vb[n+20];
                        sum1[n] += va[1] * vb[n+20];
                        sum2[n] += va[2] * vb[n+20];
                        sum3[n] += va[3] * vb[n+20];
                        va += 4;

                        sum0[n] += va[0] * vb[n+24];
                        sum1[n] += va[1] * vb[n+24];
                        sum2[n] += va[2] * vb[n+24];
                        sum3[n] += va[3] * vb[n+24];
                        va += 4;

                        sum0[n] += va[0] * vb[n+28];
                        sum1[n] += va[1] * vb[n+28];
                        sum2[n] += va[2] * vb[n+28];
                        sum3[n] += va[3] * vb[n+28];
                        va -= 28;
                    }

                    va += 32;
                    vb += 32;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum0[n] += va[0] * vb[n];
                        sum1[n] += va[1] * vb[n];
                        sum2[n] += va[2] * vb[n];
                        sum3[n] += va[3] * vb[n];
                    }
                    
                    va += 4;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output0[n] = sum0[n] + biasptr[0];
                    output1[n] = sum1[n] + biasptr[1];
                    output2[n] = sum2[n] + biasptr[2];
                    output3[n] = sum3[n] + biasptr[3];
                }
#endif // __SSE__
                output0 += 4;
                output1 += 4;
                output2 += 4;
                output3 += 4;
            }

            for (; j<N; j++)
            {                
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4);
#if __SSE__
                __m128 _sum0_3 = _mm_loadu_ps(biasptr);
                __m128 _sum0 = _mm_set1_ps(0.0);
                __m128 _sum1 = _mm_set1_ps(0.0);
                __m128 _sum2 = _mm_set1_ps(0.0);
                __m128 _sum3 = _mm_set1_ps(0.0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _vb1 = _mm_set1_ps(vb[1]);
                    __m128 _vb2 = _mm_set1_ps(vb[2]);
                    __m128 _vb3 = _mm_set1_ps(vb[3]);
                    __m128 _va0 = _mm_loadu_ps(va);
                    __m128 _va1 = _mm_loadu_ps(va+4);
                    __m128 _va2 = _mm_loadu_ps(va+8);
                    __m128 _va3 = _mm_loadu_ps(va+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_va0, _vb0));// sum0 += (k00-k30) * a00
                    _sum1 = _mm_add_ps(_sum1, _mm_mul_ps(_va1, _vb1));// sum1 += (k01-k31) * a10
                    _sum2 = _mm_add_ps(_sum2, _mm_mul_ps(_va2, _vb2));// sum2 += (k02-k32) * a20
                    _sum3 = _mm_add_ps(_sum3, _mm_mul_ps(_va3, _vb3));// sum3 += (k03-k33) * a30

                    va += 16;
                    vb += 4;
                }

                _sum0 = _mm_add_ps(_sum0, _sum1);
                _sum2 = _mm_add_ps(_sum2, _sum3);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum0);
                _sum0_3 = _mm_add_ps(_sum0_3, _sum2);

                for (; k<L; k++)
                {
                    __m128 _vb0 = _mm_set1_ps(vb[0]);
                    __m128 _va = _mm_loadu_ps(va); 

                    _sum0_3 = _mm_add_ps(_sum0_3, _mm_mul_ps(_va, _vb0));// sum0 += (k00-k30) * a00

                    va += 4;
                    vb += 1;
                }         
                output0[0] = _sum0_3[0];
                output1[0] = _sum0_3[1];
                output2[0] = _sum0_3[2];
                output3[0] = _sum0_3[3];
#else
                float sum0 = biasptr[0];
                float sum1 = biasptr[1];
                float sum2 = biasptr[2];
                float sum3 = biasptr[3];

                for (int k=0; k<L; k++)
                {
                    sum0 += va[0] * vb[0];
                    sum1 += va[1] * vb[0];
                    sum2 += va[2] * vb[0];
                    sum3 += va[3] * vb[0];

                    va += 4;
                    vb += 1;
                }
                
                output0[0] = sum0;
                output1[0] = sum1;
                output2[0] = sum2;
                output3[0] = sum3;
#endif // __SSE__
                output0++;
                output1++;
                output2++;
                output3++;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i=remain_outch_start; i<outch; i++)
        {
            float* output = top_blob.channel(i);

            const float bias0 = bias ? bias[i] : 0.f;

            int j=0;
            for (; j+3<N; j=j+4)
            {
                const float* vb = bottom_tm.channel(j/4);       
                const float* va = kernel_tm.channel(i/4 + i%4);
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(bias0);

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _va1 = _mm_set1_ps(va[1]);
                    __m128 _va2 = _mm_set1_ps(va[2]);
                    __m128 _va3 = _mm_set1_ps(va[3]);
                    __m128 _vb0 = _mm_loadu_ps(vb);
                    __m128 _vb1 = _mm_loadu_ps(vb+4);
                    __m128 _vb2 = _mm_loadu_ps(vb+8);
                    __m128 _vb3 = _mm_loadu_ps(vb+12);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));// sum0 = (a00-a03) * k00                
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb1, _va1));// sum0 += (a10-a13) * k01
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb2, _va2));// sum0 += (a20-a23) * k02
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb3, _va3));// sum0 += (a30-a33) * k03
                
                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    // k0
                    __m128 _va0 = _mm_set1_ps(va[0]);
                    __m128 _vb0 = _mm_loadu_ps(vb);

                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_vb0, _va0));    // sum0 = (a00-a03) * k00

                    va += 1;
                    vb += 4;
                }
                _mm_storeu_ps(output, _sum0); 
#else                
                float sum[4] = {0};

                int k=0;
                for (; k+3<L; k=k+4)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                        sum[n] += va[1] * vb[n+4];
                        sum[n] += va[2] * vb[n+8];
                        sum[n] += va[3] * vb[n+12];
                        //sum[n] += va[4] * vb[n+16];
                        //sum[n] += va[5] * vb[n+20];
                        //sum[n] += va[6] * vb[n+24];
                        //sum[n] += va[7] * vb[n+28];
                    }

                    va += 4;
                    vb += 16;
                }

                for (; k<L; k++)
                {
                    for (int n=0; n<4; n++)
                    {
                        sum[n] += va[0] * vb[n];
                    }

                    va += 1;
                    vb += 4;
                }

                for (int n=0; n<4; n++)
                {
                    output[n] = sum[n] + bias0;
                }
#endif // __SSE__
                output += 4;
            }

            for (; j<N; j++)
            {
                const float* vb = bottom_tm.channel(j/4 + j%4);
                const float* va = kernel_tm.channel(i/4 + i%4);

                int k=0;
#if __SSE__
                __m128 _sum0 = _mm_set1_ps(0.f);

                for (; k+3<L; k+=4)
                {
                    __m128 _p0 = _mm_loadu_ps(vb);
                    __m128 _k0 = _mm_loadu_ps(va);
                    _sum0 = _mm_add_ps(_sum0, _mm_mul_ps(_p0, _k0));

                    va += 4;
                    vb += 4;                    
                }
                float sum0 = bias0 + _sum0[0] + _sum0[1] + _sum0[2] + _sum0[3];
#else
                float sum0 = bias0;
#endif // __SSE__
                for (; k<L; k++)
                {
                    sum0 += va[0] * vb[0];

                    va += 1;
                    vb += 1;
                }
                output[0] = sum0;

                output++;
            }
        }
    }   
}